

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# occlusion_tester.h
# Opt level: O2

void __thiscall OcclusionTester::set_points(OcclusionTester *this,Vec3f_8 *a,Vec3f_8 *b)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  undefined1 in_ZMM3 [64];
  undefined1 auVar20 [64];
  undefined4 in_register_0000131c;
  
  auVar16 = vsubps_avx(*(undefined1 (*) [32])b->x,*(undefined1 (*) [32])a->x);
  auVar17 = vsubps_avx(*(undefined1 (*) [32])b->y,*(undefined1 (*) [32])a->y);
  auVar18 = vsubps_avx(*(undefined1 (*) [32])b->z,*(undefined1 (*) [32])a->z);
  fVar1 = auVar16._0_4_;
  auVar20._0_4_ = fVar1 * fVar1;
  fVar3 = auVar16._4_4_;
  auVar20._4_4_ = fVar3 * fVar3;
  fVar5 = auVar16._8_4_;
  auVar20._8_4_ = fVar5 * fVar5;
  fVar7 = auVar16._12_4_;
  auVar20._12_4_ = fVar7 * fVar7;
  fVar9 = auVar16._16_4_;
  auVar20._16_4_ = fVar9 * fVar9;
  fVar11 = auVar16._20_4_;
  auVar20._20_4_ = fVar11 * fVar11;
  fVar13 = auVar16._24_4_;
  auVar20._28_36_ = in_ZMM3._28_36_;
  auVar20._24_4_ = fVar13 * fVar13;
  auVar19 = vfmadd231ps_fma(auVar20._0_32_,auVar17,auVar17);
  auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar18,auVar18);
  auVar15 = vsqrtps_avx(ZEXT1632(auVar19));
  auVar15 = vrcpps_avx(auVar15);
  fVar2 = auVar15._0_4_;
  fVar4 = auVar15._4_4_;
  fVar6 = auVar15._8_4_;
  fVar8 = auVar15._12_4_;
  fVar10 = auVar15._16_4_;
  fVar12 = auVar15._20_4_;
  fVar14 = auVar15._24_4_;
  memmove(this,a,0x60);
  *(ulong *)(this->rays).d.x = CONCAT44(fVar3 * fVar4,fVar1 * fVar2);
  *(ulong *)((this->rays).d.x + 2) = CONCAT44(fVar7 * fVar8,fVar5 * fVar6);
  *(ulong *)((this->rays).d.x + 4) = CONCAT44(fVar11 * fVar12,fVar9 * fVar10);
  *(ulong *)((this->rays).d.x + 6) = CONCAT44(auVar16._28_4_,fVar13 * fVar14);
  *(ulong *)(this->rays).d.y = CONCAT44(auVar17._4_4_ * fVar4,auVar17._0_4_ * fVar2);
  *(ulong *)((this->rays).d.y + 2) = CONCAT44(auVar17._12_4_ * fVar8,auVar17._8_4_ * fVar6);
  *(ulong *)((this->rays).d.y + 4) = CONCAT44(auVar17._20_4_ * fVar12,auVar17._16_4_ * fVar10);
  *(ulong *)((this->rays).d.y + 6) = CONCAT44(in_register_0000131c,auVar17._24_4_ * fVar14);
  *(ulong *)(this->rays).d.z = CONCAT44(auVar18._4_4_ * fVar4,auVar18._0_4_ * fVar2);
  *(ulong *)((this->rays).d.z + 2) = CONCAT44(auVar18._12_4_ * fVar8,auVar18._8_4_ * fVar6);
  *(ulong *)((this->rays).d.z + 4) = CONCAT44(auVar18._20_4_ * fVar12,auVar18._16_4_ * fVar10);
  *(ulong *)((this->rays).d.z + 6) = CONCAT44(auVar17._28_4_,auVar18._24_4_ * fVar14);
  (this->rays).t_min[0] = 0.001;
  (this->rays).t_min[1] = 0.001;
  (this->rays).t_min[2] = 0.001;
  (this->rays).t_min[3] = 0.001;
  (this->rays).t_min[4] = 0.001;
  (this->rays).t_min[5] = 0.001;
  (this->rays).t_min[6] = 0.001;
  (this->rays).t_min[7] = 0.001;
  (this->rays).t_max[0] = 0.999;
  (this->rays).t_max[1] = 0.999;
  (this->rays).t_max[2] = 0.999;
  (this->rays).t_max[3] = 0.999;
  (this->rays).t_max[4] = 0.999;
  (this->rays).t_max[5] = 0.999;
  (this->rays).t_max[6] = 0.999;
  (this->rays).t_max[7] = 0.999;
  (this->rays).active[0] = -0.0;
  (this->rays).active[1] = -0.0;
  (this->rays).active[2] = -0.0;
  (this->rays).active[3] = -0.0;
  (this->rays).active[4] = -0.0;
  (this->rays).active[5] = -0.0;
  (this->rays).active[6] = -0.0;
  (this->rays).active[7] = -0.0;
  return;
}

Assistant:

inline void set_points(const Vec3f_8 &a, const Vec3f_8 &b){
		rays = Ray8{a, (b - a).normalized(), 0.001f, 0.999f};
	}